

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGraphicsObject_*,_QHashDummyValue>_>::rehash
          (Data<QHashPrivate::Node<QGraphicsObject_*,_QHashDummyValue>_> *this,size_t sizeHint)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  Node<QGraphicsObject_*,_QHashDummyValue> *pNVar3;
  ulong uVar4;
  size_t index;
  long lVar5;
  Span *pSVar6;
  size_t numBuckets;
  long lVar7;
  long in_FS_OFFSET;
  R RVar8;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if (0x40 < sizeHint) {
    if (sizeHint >> 0x3e == 0) {
      lVar5 = 0x3f;
      if (sizeHint != 0) {
        for (; sizeHint >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar5 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar8 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar8.spans;
  this->numBuckets = numBuckets;
  pSVar6 = pSVar2;
  for (uVar4 = 0; uVar4 != uVar1 >> 7; uVar4 = uVar4 + 1) {
    for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 1) {
      if ((ulong)pSVar6->offsets[lVar5] != 0xff) {
        key = pSVar2[uVar4].entries + pSVar6->offsets[lVar5];
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = Data<QHashPrivate::Node<QGraphicsObject*,QHashDummyValue>>::
                   findBucket<QGraphicsObject*>
                             ((Data<QHashPrivate::Node<QGraphicsObject*,QHashDummyValue>> *)this,
                              (QGraphicsObject **)key);
        pNVar3 = Bucket::insert(&local_48);
        pNVar3->key = *(QGraphicsObject **)(key->storage).data;
      }
    }
    Span<QHashPrivate::Node<QGraphicsObject_*,_QHashDummyValue>_>::freeData(pSVar2 + uVar4);
    pSVar6 = pSVar6 + 1;
  }
  if (pSVar2 != (Span *)0x0) {
    lVar5 = *(long *)&pSVar2[-1].allocated;
    if (lVar5 != 0) {
      lVar7 = lVar5 * 0x90;
      do {
        Span<QHashPrivate::Node<QGraphicsObject_*,_QHashDummyValue>_>::freeData
                  ((Span<QHashPrivate::Node<QGraphicsObject_*,_QHashDummyValue>_> *)
                   (pSVar2[-1].offsets + lVar7));
        lVar7 = lVar7 + -0x90;
      } while (lVar7 != 0);
    }
    operator_delete__(&pSVar2[-1].allocated,lVar5 * 0x90 | 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }